

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmHttpSplitEncodedQuery(jx9_vm *pVm,SyString *pQuery,SyBlob *pWorker,int is_post)

{
  sxu32 nKeylen;
  uint uVar1;
  char *zKey;
  jx9_value *pjVar2;
  jx9_value *pjVar3;
  ushort **ppuVar4;
  jx9_value *zSrc;
  bool bVar5;
  jx9_value *pjStack_70;
  sxu32 nBlobOfft;
  char *zPtr;
  SyString sValue;
  SyString sName;
  jx9_value *pRequest;
  jx9_value *pGet;
  char *zIn;
  char *zEnd;
  int is_post_local;
  SyBlob *pWorker_local;
  SyString *pQuery_local;
  jx9_vm *pVm_local;
  
  pjVar2 = (jx9_value *)(pQuery->zString + pQuery->nByte);
  pGet = (jx9_value *)pQuery->zString;
  if (is_post == 0) {
    pRequest = VmExtractSuper(pVm,"_GET",4);
  }
  else {
    pRequest = VmExtractSuper(pVm,"_POST",5);
  }
  pjVar3 = VmExtractSuper(pVm,"_REQUEST",8);
  while( true ) {
    while( true ) {
      bVar5 = false;
      if (pGet < pjVar2) {
        ppuVar4 = __ctype_b_loc();
        bVar5 = ((*ppuVar4)[(int)*(char *)&pGet->x] & 0x2000) != 0;
      }
      if (!bVar5) break;
      pGet = (jx9_value *)((long)&pGet->x + 1);
    }
    if (pjVar2 <= pGet) break;
    pjStack_70 = pGet;
    while( true ) {
      bVar5 = false;
      if (((pjStack_70 < pjVar2) && (bVar5 = false, *(char *)&pjStack_70->x != '=')) &&
         (bVar5 = false, *(char *)&pjStack_70->x != '&')) {
        bVar5 = *(char *)&pjStack_70->x != ';';
      }
      if (!bVar5) break;
      pjStack_70 = (jx9_value *)((long)&pjStack_70->x + 1);
    }
    SyBlobReset(pWorker);
    SyUriDecode((char *)pGet,(int)pjStack_70 - (int)pGet,jx9VmBlobConsumer,pWorker,1);
    nKeylen = pWorker->nByte;
    zPtr = (char *)0x0;
    sValue.zString._0_4_ = 0;
    if ((pjStack_70 < pjVar2) && (*(char *)&pjStack_70->x == '=')) {
      zSrc = (jx9_value *)((long)&(pjStack_70->x).rVal + 1);
      pjStack_70 = zSrc;
      while( true ) {
        bVar5 = false;
        if ((pjStack_70 < pjVar2) && (bVar5 = false, *(char *)&pjStack_70->x != '&')) {
          bVar5 = *(char *)&pjStack_70->x != ';';
        }
        if (!bVar5) break;
        pjStack_70 = (jx9_value *)((long)&pjStack_70->x + 1);
      }
      if (zSrc < pjStack_70) {
        uVar1 = pWorker->nByte;
        SyUriDecode((char *)zSrc,(int)pjStack_70 - (int)zSrc,jx9VmBlobConsumer,pWorker,1);
        zPtr = (char *)((long)pWorker->pBlob + (ulong)uVar1);
        sValue.zString._0_4_ = pWorker->nByte - uVar1;
      }
    }
    zKey = (char *)pWorker->pBlob;
    if ((pRequest != (jx9_value *)0x0) && ((pRequest->iFlags & 0x40U) != 0)) {
      VmHashmapInsert((jx9_hashmap *)(pRequest->x).pOther,zKey,nKeylen,zPtr,(int)sValue.zString);
    }
    if ((pjVar3 != (jx9_value *)0x0) && ((pjVar3->iFlags & 0x40U) != 0)) {
      VmHashmapInsert((jx9_hashmap *)(pjVar3->x).pOther,zKey,nKeylen,zPtr,(int)sValue.zString);
    }
    pGet = (jx9_value *)((long)&pjStack_70->x + 1);
  }
  return 0;
}

Assistant:

static sxi32 VmHttpSplitEncodedQuery(
	 jx9_vm *pVm,       /* Target VM */
	 SyString *pQuery,  /* Raw query to decode */
	 SyBlob *pWorker,   /* Working buffer */
	 int is_post        /* TRUE if we are dealing with a POST request */
	 )
 {
	 const char *zEnd = &pQuery->zString[pQuery->nByte];
	 const char *zIn = pQuery->zString;
	 jx9_value *pGet, *pRequest;
	 SyString sName, sValue;
	 const char *zPtr;
	 sxu32 nBlobOfft;
	 /* Extract superglobals */
	 if( is_post ){
		 /* $_POST superglobal */
		 pGet = VmExtractSuper(&(*pVm), "_POST", sizeof("_POST")-1);
	 }else{
		 /* $_GET superglobal */
		 pGet = VmExtractSuper(&(*pVm), "_GET", sizeof("_GET")-1);
	 }
	 pRequest = VmExtractSuper(&(*pVm), "_REQUEST", sizeof("_REQUEST")-1);
	 /* Split up the raw query */
	 for(;;){
		 /* Jump leading white spaces */
		 while(zIn < zEnd  && SyisSpace(zIn[0]) ){
			 zIn++;
		 }
		 if( zIn >= zEnd ){
			 break;
		 }
		 zPtr = zIn;
		 while( zPtr < zEnd && zPtr[0] != '=' && zPtr[0] != '&' && zPtr[0] != ';' ){
			 zPtr++;
		 }
		 /* Reset the working buffer */
		 SyBlobReset(pWorker);
		 /* Decode the entry */
		 SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
		 /* Save the entry */
		 sName.nByte = SyBlobLength(pWorker);
		 sValue.zString = 0;
		 sValue.nByte = 0;
		 if( zPtr < zEnd && zPtr[0] == '=' ){
			 zPtr++;
			 zIn = zPtr;
			 /* Store field value */
			 while( zPtr < zEnd && zPtr[0] != '&' && zPtr[0] != ';' ){
				 zPtr++;
			 }
			 if( zPtr > zIn ){
				 /* Decode the value */
				  nBlobOfft = SyBlobLength(pWorker);
				  SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
				  sValue.zString = (const char *)SyBlobDataAt(pWorker, nBlobOfft);
				  sValue.nByte = SyBlobLength(pWorker) - nBlobOfft;
				 
			 }
			 /* Synchronize pointers */
			 zIn = zPtr;
		 }
		 sName.zString = (const char *)SyBlobData(pWorker);
		 /* Install the decoded query in the $_GET/$_REQUEST array */
		 if( pGet && (pGet->iFlags & MEMOBJ_HASHMAP) ){
			 VmHashmapInsert((jx9_hashmap *)pGet->x.pOther, 
				 sName.zString, (int)sName.nByte, 
				 sValue.zString, (int)sValue.nByte
				 );
		 }
		 if( pRequest && (pRequest->iFlags & MEMOBJ_HASHMAP) ){
			 VmHashmapInsert((jx9_hashmap *)pRequest->x.pOther, 
				 sName.zString, (int)sName.nByte, 
				 sValue.zString, (int)sValue.nByte
					 );
		 }
		 /* Advance the pointer */
		 zIn = &zPtr[1];
	 }
	/* All done*/
	return SXRET_OK;
 }